

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  undefined1 uVar3;
  short sVar4;
  ushort uVar5;
  long lVar6;
  short sVar7;
  bool bVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  stbi__uint32 sVar17;
  stbi__uint32 sVar18;
  stbi__uint32 sVar19;
  stbi_uc asVar20 [4];
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  void *pvVar28;
  stbi__jpeg *psVar29;
  stbi_uc *psVar30;
  long lVar31;
  uchar *puVar32;
  stbi__uint16 *data;
  code *pcVar33;
  undefined8 uVar34;
  char *pcVar35;
  long lVar36;
  short sVar37;
  stbi_uc *pal_entry;
  stbi__uint16 *psVar38;
  stbi__jpeg *psVar39;
  int id;
  ulong uVar40;
  stbi__context *psVar41;
  int iVar42;
  undefined1 *puVar43;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar44;
  byte *pbVar45;
  stbi__result_info *ri_00;
  int iVar46;
  ulong uVar47;
  stbi__uint16 *psVar48;
  uint uVar49;
  int iVar50;
  ulong uVar51;
  int iVar52;
  uint uVar53;
  ulong uVar54;
  stbi_uc *psVar55;
  short *psVar56;
  stbi_uc *psVar57;
  long *in_FS_OFFSET;
  bool bVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  stbi__context *local_8980;
  uint local_8950;
  stbi__jpeg *local_8938;
  uint local_8914;
  uint local_8900;
  int local_88fc;
  stbi_uc value [4];
  int iStack_88f4;
  int iStack_88f0;
  uint uStack_88ec;
  uint local_88e8;
  uint uStack_88e4;
  uint uStack_88e0;
  int local_88d8;
  uint local_88bc;
  stbi_uc pal [256] [4];
  
  psVar57 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  iVar16 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar16 != 0) {
    if ((uint)req_comp < 5) {
      pal._0_8_ = s;
      iVar16 = stbi__parse_png_file((stbi__png *)pal,0,req_comp);
      uVar34 = pal._0_8_;
      if (iVar16 == 0) {
        local_8980 = (stbi__context *)0x0;
      }
      else {
        if ((int)pal[8] < 9) {
          iVar16 = 8;
        }
        else {
          if (pal[8] != (stbi_uc  [4])0x10) {
            lVar36 = *in_FS_OFFSET;
            pcVar35 = "bad bits_per_channel";
            goto LAB_0019e743;
          }
          iVar16 = 0x10;
        }
        ri->bits_per_channel = iVar16;
        if ((req_comp != 0) && (iVar16 = *(int *)(pal._0_8_ + 0xc), iVar16 != req_comp)) {
          if ((int)pal[8] < 9) {
            pal._24_8_ = stbi__convert_format
                                   ((uchar *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                    *(uint *)(pal._0_8_ + 4));
          }
          else {
            pal._24_8_ = stbi__convert_format16
                                   ((stbi__uint16 *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                    *(uint *)(pal._0_8_ + 4));
          }
          *(int *)(uVar34 + 0xc) = req_comp;
          if ((stbi__context *)pal._24_8_ == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(int *)uVar34;
        *y = *(int *)(uVar34 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar34 + 8);
        }
        local_8980 = (stbi__context *)pal._24_8_;
        pal._24_8_ = (void *)0x0;
      }
      free((void *)pal._24_8_);
      free((void *)pal._16_8_);
      psVar29 = (stbi__jpeg *)pal._8_8_;
      goto LAB_0019eb5c;
    }
    lVar36 = *in_FS_OFFSET;
    pcVar35 = "bad req_comp";
    goto LAB_0019e743;
  }
  sVar9 = stbi__get8(s);
  if ((sVar9 == 'B') && (sVar9 = stbi__get8(s), sVar9 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar17 = stbi__get32le(s);
    if (((0x38 < sVar17) || ((0x100010000001000U >> ((ulong)sVar17 & 0x3f) & 1) == 0)) &&
       ((sVar17 != 0x7c && (sVar17 != 0x6c)))) goto LAB_0019e8d5;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    pvVar28 = stbi__bmp_parse_header(s,(stbi__bmp_data *)value);
    if (pvVar28 == (void *)0x0) {
      return (void *)0x0;
    }
    sVar17 = s->img_y;
    uVar23 = -sVar17;
    if (0 < (int)sVar17) {
      uVar23 = sVar17;
    }
    s->img_y = uVar23;
    if ((0x1000000 < uVar23) || (uVar24 = s->img_x, 0x1000000 < uVar24)) goto LAB_001a0f5d;
    if (iStack_88f0 == 0xc) {
      if (0x17 < (int)value) goto LAB_0019f400;
      uVar25 = ((iStack_88f4 - local_88d8) + -0x18) / 3;
LAB_0019f3ce:
      if (uVar25 == 0) goto LAB_0019f400;
      bVar8 = false;
LAB_0019f478:
      bVar58 = uStack_88e0 == 0xff000000;
      iVar16 = 4 - (uint)(uStack_88e0 == 0);
      asVar20 = value;
    }
    else {
      if ((int)value < 0x10) {
        uVar25 = iStack_88f4 - (local_88d8 + iStack_88f0) >> 2;
        goto LAB_0019f3ce;
      }
LAB_0019f400:
      if (s->img_buffer + ((long)s->callback_already_read - (long)s->img_buffer_original) !=
          (stbi_uc *)(long)iStack_88f4) {
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "bad offset";
        goto LAB_0019e743;
      }
      uVar25 = 0;
      bVar58 = true;
      bVar8 = bVar58;
      if (value != (stbi_uc  [4])0x18 || uStack_88e0 != 0xff000000) goto LAB_0019f478;
      iVar16 = 3;
      asVar20[0] = '\x18';
      asVar20[1] = '\0';
      asVar20[2] = '\0';
      asVar20[3] = '\0';
      bVar8 = true;
    }
    local_8914 = 0xff;
    s->img_n = iVar16;
    if (2 < req_comp) {
      iVar16 = req_comp;
    }
    iVar21 = stbi__mad3sizes_valid(iVar16,uVar24,uVar23,0);
    if (iVar21 == 0) goto LAB_001a0f5d;
    puVar32 = (uchar *)stbi__malloc_mad3(iVar16,uVar24,uVar23,0);
    if (puVar32 != (uchar *)0x0) {
      if ((int)asVar20 < 0x10) {
        if (!bVar8 && (int)uVar25 < 0x101) {
          uVar51 = 0;
          uVar47 = 0;
          if (0 < (int)uVar25) {
            uVar47 = (ulong)uVar25;
          }
          for (; uVar47 != uVar51; uVar51 = uVar51 + 1) {
            sVar9 = stbi__get8(s);
            pal[uVar51][2] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar51][1] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar51][0] = sVar9;
            if (iStack_88f0 != 0xc) {
              stbi__get8(s);
            }
            pal[uVar51][3] = 0xff;
          }
          stbi__skip(s,(uVar25 * (iStack_88f0 == 0xc | 0xfffffffc) + iStack_88f4) -
                       (iStack_88f0 + local_88d8));
          if (asVar20 == (stbi_uc  [4])0x1) {
            sVar19 = s->img_x;
            iVar21 = 0;
            uVar47 = 0;
LAB_001a0896:
            sVar18 = s->img_y;
            if (iVar21 < (int)sVar18) {
              iVar52 = 0;
              do {
                bVar12 = stbi__get8(s);
                sVar18 = s->img_x;
                iVar42 = 8;
                do {
                  if ((int)sVar18 <= iVar52) {
LAB_001a0935:
                    uVar47 = uVar47 & 0xffffffff;
                    stbi__skip(s,-(sVar19 + 7 >> 3) & 3);
                    iVar21 = iVar21 + 1;
                    goto LAB_001a0896;
                  }
                  bVar58 = (bVar12 >> (iVar42 - 1U & 0x1f) & 1) != 0;
                  iVar46 = (int)uVar47;
                  lVar36 = (long)iVar46;
                  uVar47 = lVar36 + 3;
                  puVar32[lVar36] = pal[bVar58][0];
                  puVar32[lVar36 + 1] = pal[bVar58][1];
                  puVar32[lVar36 + 2] = pal[bVar58][2];
                  if (iVar16 == 4) {
                    puVar32[lVar36 + 3] = 0xff;
                    uVar47 = (ulong)(iVar46 + 4);
                  }
                  if (sVar18 - 1 == iVar52) goto LAB_001a0935;
                  iVar52 = iVar52 + 1;
                  iVar46 = iVar42 + -1;
                  bVar58 = 0 < iVar42;
                  iVar42 = iVar46;
                } while (iVar46 != 0 && bVar58);
              } while( true );
            }
          }
          else {
            if (asVar20 == (stbi_uc  [4])0x8) {
              uVar23 = s->img_x;
            }
            else {
              if (asVar20 != (stbi_uc  [4])0x4) {
                free(puVar32);
                lVar36 = *in_FS_OFFSET;
                pcVar35 = "bad bpp";
                goto LAB_0019e743;
              }
              uVar23 = s->img_x + 1 >> 1;
            }
            local_8950 = -uVar23 & 3;
            uVar47 = 0;
            for (iVar21 = 0; sVar18 = s->img_y, iVar21 < (int)sVar18; iVar21 = iVar21 + 1) {
              for (iVar52 = 0; iVar52 < (int)s->img_x; iVar52 = iVar52 + 2) {
                bVar12 = stbi__get8(s);
                uVar23 = (uint)(bVar12 >> 4);
                if (asVar20 != (stbi_uc  [4])0x4) {
                  uVar23 = (uint)bVar12;
                }
                uVar24 = bVar12 & 0xf;
                if (asVar20 != (stbi_uc  [4])0x4) {
                  uVar24 = 0;
                }
                lVar36 = (long)(int)uVar47;
                uVar51 = lVar36 + 3;
                puVar32[lVar36] = pal[uVar23][0];
                puVar32[lVar36 + 1] = pal[uVar23][1];
                puVar32[lVar36 + 2] = pal[uVar23][2];
                if (iVar16 == 4) {
                  puVar32[lVar36 + 3] = 0xff;
                  uVar51 = (ulong)((int)uVar47 + 4);
                }
                if (iVar52 + 1U == s->img_x) {
                  uVar47 = uVar51 & 0xffffffff;
                  break;
                }
                if (asVar20 == (stbi_uc  [4])0x8) {
                  bVar12 = stbi__get8(s);
                  uVar24 = (uint)bVar12;
                }
                lVar36 = (long)(int)uVar51;
                uVar47 = lVar36 + 3;
                puVar32[lVar36] = pal[uVar24][0];
                puVar32[lVar36 + 1] = pal[uVar24][1];
                puVar32[lVar36 + 2] = pal[uVar24][2];
                if (iVar16 == 4) {
                  puVar32[lVar36 + 3] = 0xff;
                  uVar47 = (ulong)((int)uVar51 + 4);
                }
              }
              stbi__skip(s,local_8950);
            }
          }
          goto LAB_001a0957;
        }
        free(puVar32);
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "invalid";
        goto LAB_0019e743;
      }
      stbi__skip(s,iStack_88f4 - (iStack_88f0 + local_88d8));
      if (asVar20 != (stbi_uc  [4])0x10) {
        if (asVar20 == (stbi_uc  [4])0x20) {
          local_8900 = 0;
          if ((bool)((uStack_88ec == 0xff0000 && (local_88e8 == 0xff00 && uStack_88e4 == 0xff)) &
                    bVar58)) {
            bVar58 = true;
            goto LAB_001a03d8;
          }
          goto LAB_001a0436;
        }
        local_8900 = 0;
        if (asVar20 != (stbi_uc  [4])0x18) goto LAB_001a0436;
        local_8900 = s->img_x & 3;
        bVar58 = false;
LAB_001a03d8:
        bVar8 = false;
        iVar21 = 0;
        iVar42 = 0;
        iVar52 = 0;
        local_88fc = 0;
        uVar23 = 0;
        uVar24 = 0;
        uVar25 = 0;
        local_88bc = 0;
LAB_001a05ad:
        uVar47 = 0;
        for (iVar46 = 0; sVar18 = s->img_y, iVar46 < (int)sVar18; iVar46 = iVar46 + 1) {
          if (bVar8) {
            for (iVar50 = 0; iVar50 < (int)s->img_x; iVar50 = iVar50 + 1) {
              if (asVar20 == (stbi_uc  [4])0x10) {
                uVar26 = stbi__get16le(s);
              }
              else {
                uVar26 = stbi__get32le(s);
              }
              iVar27 = stbi__shiftsigned(uVar26 & uStack_88ec,iVar21,uVar23);
              lVar36 = (long)(int)uVar47;
              puVar32[lVar36] = (uchar)iVar27;
              iVar27 = stbi__shiftsigned(uVar26 & local_88e8,iVar42,uVar24);
              puVar32[lVar36 + 1] = (uchar)iVar27;
              iVar27 = stbi__shiftsigned(uVar26 & uStack_88e4,iVar52,uVar25);
              puVar32[lVar36 + 2] = (uchar)iVar27;
              if (uStack_88e0 == 0) {
                uVar26 = 0xff;
              }
              else {
                uVar26 = stbi__shiftsigned(uVar26 & uStack_88e0,local_88fc,local_88bc);
              }
              uVar51 = lVar36 + 3;
              if (iVar16 == 4) {
                puVar32[lVar36 + 3] = (uchar)uVar26;
                uVar51 = (ulong)((int)uVar47 + 4);
              }
              local_8914 = local_8914 | uVar26;
              uVar47 = uVar51 & 0xffffffff;
            }
          }
          else {
            for (iVar50 = 0; iVar50 < (int)s->img_x; iVar50 = iVar50 + 1) {
              sVar9 = stbi__get8(s);
              lVar36 = (long)(int)uVar47;
              puVar32[lVar36 + 2] = sVar9;
              sVar9 = stbi__get8(s);
              puVar32[lVar36 + 1] = sVar9;
              sVar9 = stbi__get8(s);
              puVar32[lVar36] = sVar9;
              bVar12 = 0xff;
              if (bVar58) {
                bVar12 = stbi__get8(s);
              }
              uVar51 = lVar36 + 3;
              if (iVar16 == 4) {
                puVar32[lVar36 + 3] = bVar12;
                uVar51 = (ulong)((int)uVar47 + 4);
              }
              local_8914 = local_8914 | bVar12;
              uVar47 = uVar51 & 0xffffffff;
            }
          }
          stbi__skip(s,local_8900);
        }
LAB_001a0957:
        if ((iVar16 == 4) && (local_8914 == 0)) {
          for (uVar23 = s->img_x * sVar18 * 4 - 1; -1 < (int)uVar23; uVar23 = uVar23 - 4) {
            puVar32[uVar23] = 0xff;
          }
        }
        if (0 < (int)sVar17) {
          iVar21 = (int)sVar18 >> 1;
          if ((int)sVar18 >> 1 < 1) {
            iVar21 = 0;
          }
          iVar52 = (sVar18 - 1) * iVar16;
          iVar46 = 0;
          for (iVar42 = 0; iVar42 != iVar21; iVar42 = iVar42 + 1) {
            sVar17 = s->img_x;
            uVar47 = (ulong)(sVar17 * iVar16);
            if ((int)(sVar17 * iVar16) < 1) {
              uVar47 = 0;
            }
            for (uVar51 = 0; uVar47 != uVar51; uVar51 = uVar51 + 1) {
              uVar2 = puVar32[uVar51 + sVar17 * iVar46];
              puVar32[uVar51 + sVar17 * iVar46] = puVar32[uVar51 + sVar17 * iVar52];
              puVar32[uVar51 + sVar17 * iVar52] = uVar2;
            }
            iVar52 = iVar52 - iVar16;
            iVar46 = iVar46 + iVar16;
          }
        }
        uVar23 = s->img_x;
        if ((req_comp != 0) && (iVar16 != req_comp)) {
          puVar32 = stbi__convert_format(puVar32,iVar16,req_comp,uVar23,sVar18);
          if (puVar32 == (uchar *)0x0) {
            return (void *)0x0;
          }
          uVar23 = s->img_x;
        }
        *x = uVar23;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return puVar32;
        }
        return puVar32;
      }
      local_8900 = s->img_x * 2 & 2;
LAB_001a0436:
      if ((local_88e8 != 0 && uStack_88ec != 0) && uStack_88e4 != 0) {
        iVar21 = stbi__high_bit(uStack_88ec);
        uVar23 = stbi__bitcount(uStack_88ec);
        iVar42 = stbi__high_bit(local_88e8);
        uVar24 = stbi__bitcount(local_88e8);
        iVar52 = stbi__high_bit(uStack_88e4);
        uVar25 = stbi__bitcount(uStack_88e4);
        local_88fc = stbi__high_bit(uStack_88e0);
        local_88bc = stbi__bitcount(uStack_88e0);
        if ((uVar25 < 9 && (uVar24 < 9 && uVar23 < 9)) && local_88bc < 9) {
          iVar21 = iVar21 + -7;
          iVar42 = iVar42 + -7;
          iVar52 = iVar52 + -7;
          local_88fc = local_88fc + -7;
          bVar8 = true;
          bVar58 = false;
          goto LAB_001a05ad;
        }
      }
      free(puVar32);
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "bad masks";
      goto LAB_0019e743;
    }
LAB_001a01b0:
    lVar36 = *in_FS_OFFSET;
    pcVar35 = "outofmem";
    goto LAB_0019e743;
  }
LAB_0019e8d5:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar16 = stbi__gif_test(s);
  if (iVar16 != 0) {
    memset((stbi__gif *)pal,0,0x8870);
    local_8980 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)pal,comp,0,psVar57);
    if (local_8980 == (stbi__context *)0x0 || local_8980 == s) {
      free((void *)pal._8_8_);
      local_8980 = (stbi__context *)0x0;
    }
    else {
      *x = (int)pal[0];
      *y = (int)pal[1];
      if ((req_comp & 0xfffffffbU) != 0) {
        local_8980 = (stbi__context *)
                     stbi__convert_format((uchar *)local_8980,4,req_comp,(uint)pal[0],(uint)pal[1]);
      }
    }
    free((void *)pal._24_8_);
    psVar29 = (stbi__jpeg *)pal._16_8_;
    goto LAB_0019eb5c;
  }
  sVar17 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar17 == 0x38425053) {
    sVar17 = stbi__get32be(s);
    if (sVar17 != 0x38425053) {
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "not PSD";
      goto LAB_0019e743;
    }
    iVar16 = stbi__get16be(s);
    if (iVar16 != 1) {
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "wrong version";
      goto LAB_0019e743;
    }
    stbi__skip(s,6);
    uVar23 = stbi__get16be(s);
    if (0x10 < uVar23) {
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "wrong channel count";
      goto LAB_0019e743;
    }
    sVar17 = stbi__get32be(s);
    sVar18 = stbi__get32be(s);
    if (((int)sVar17 < 0x1000001) && ((int)sVar18 < 0x1000001)) {
      iVar16 = stbi__get16be(s);
      if ((iVar16 != 8) && (iVar16 != 0x10)) {
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "unsupported bit depth";
        goto LAB_0019e743;
      }
      iVar21 = stbi__get16be(s);
      if (iVar21 != 3) {
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "wrong color format";
        goto LAB_0019e743;
      }
      sVar19 = stbi__get32be(s);
      stbi__skip(s,sVar19);
      sVar19 = stbi__get32be(s);
      stbi__skip(s,sVar19);
      sVar19 = stbi__get32be(s);
      stbi__skip(s,sVar19);
      uVar24 = stbi__get16be(s);
      if (1 < uVar24) {
        lVar36 = *in_FS_OFFSET;
        pcVar35 = "bad compression";
        goto LAB_0019e743;
      }
      iVar21 = stbi__mad3sizes_valid(4,sVar18,sVar17,0);
      if (iVar21 != 0) {
        if (((bpc == 0x10) && (iVar16 == 0x10)) && (uVar24 == 0)) {
          data = (stbi__uint16 *)stbi__malloc_mad3(8,sVar18,sVar17,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          data = (stbi__uint16 *)malloc((long)(int)(sVar17 * sVar18 * 4));
        }
        if (data != (stbi__uint16 *)0x0) {
          uVar25 = sVar18 * sVar17;
          if (uVar24 == 0) {
            uVar47 = 0;
            psVar38 = data;
            psVar48 = data;
            uVar24 = 0;
            if (0 < (int)uVar25) {
              uVar24 = uVar25;
            }
            for (; uVar47 != 4; uVar47 = uVar47 + 1) {
              if (uVar47 < uVar23) {
                if (ri->bits_per_channel == 0x10) {
                  for (lVar36 = 0; uVar24 != (uint)lVar36; lVar36 = lVar36 + 1) {
                    iVar21 = stbi__get16be(s);
                    psVar48[lVar36 * 4] = (stbi__uint16)iVar21;
                  }
                }
                else {
                  lVar36 = 0;
                  if (iVar16 == 0x10) {
                    for (; uVar24 != (uint)lVar36; lVar36 = lVar36 + 1) {
                      iVar21 = stbi__get16be(s);
                      *(char *)(psVar38 + lVar36 * 2) = (char)((uint)iVar21 >> 8);
                    }
                  }
                  else {
                    for (; uVar24 != (uint)lVar36; lVar36 = lVar36 + 1) {
                      sVar9 = stbi__get8(s);
                      *(stbi_uc *)(psVar38 + lVar36 * 2) = sVar9;
                    }
                  }
                }
              }
              else if (iVar16 == 0x10 && bpc == 0x10) {
                for (lVar36 = 0; uVar24 != (uint)lVar36; lVar36 = lVar36 + 1) {
                  psVar48[lVar36 * 4] = -(ushort)(uVar47 == 3);
                }
              }
              else {
                for (lVar36 = 0; uVar24 != (uint)lVar36; lVar36 = lVar36 + 1) {
                  *(char *)(psVar38 + lVar36 * 2) = -(uVar47 == 3);
                }
              }
              psVar38 = (stbi__uint16 *)((long)psVar38 + 1);
              psVar48 = psVar48 + 1;
            }
          }
          else {
            stbi__skip(s,sVar17 * uVar23 * 2);
            uVar47 = 0;
            psVar38 = data;
            uVar24 = 0;
            if (0 < (int)uVar25) {
              uVar24 = uVar25;
            }
            for (; uVar47 != 4; uVar47 = uVar47 + 1) {
              if (uVar47 < uVar23) {
                psVar57 = (stbi_uc *)((long)data + uVar47);
                iVar16 = 0;
                do {
                  uVar26 = uVar25 - iVar16;
                  do {
                    if ((int)uVar26 < 1) goto LAB_001a0d46;
                    bVar12 = stbi__get8(s);
                  } while (bVar12 == 0x80);
                  uVar53 = (uint)bVar12;
                  if ((char)bVar12 < '\0') {
                    uVar49 = 0x101 - uVar53;
                    if (uVar26 < uVar49) goto LAB_001a1b45;
                    sVar9 = stbi__get8(s);
                    for (iVar21 = uVar53 - 0x101; iVar21 != 0; iVar21 = iVar21 + 1) {
                      *psVar57 = sVar9;
                      psVar57 = psVar57 + 4;
                    }
                  }
                  else {
                    if (uVar26 <= bVar12) {
LAB_001a1b45:
                      free(data);
                      lVar36 = *in_FS_OFFSET;
                      pcVar35 = "corrupt";
                      goto LAB_0019e743;
                    }
                    uVar49 = uVar53 + 1;
                    uVar26 = uVar49;
                    while (bVar58 = uVar26 != 0, uVar26 = uVar26 - 1, bVar58) {
                      sVar9 = stbi__get8(s);
                      *psVar57 = sVar9;
                      psVar57 = psVar57 + 4;
                    }
                  }
                  iVar16 = iVar16 + uVar49;
                } while( true );
              }
              for (lVar36 = 0; uVar24 != (uint)lVar36; lVar36 = lVar36 + 1) {
                *(char *)(psVar38 + lVar36 * 2) = -(uVar47 == 3);
              }
LAB_001a0d46:
              psVar38 = (stbi__uint16 *)((long)psVar38 + 1);
            }
          }
          if (3 < uVar23) {
            uVar47 = 0;
            if (0 < (int)uVar25) {
              uVar47 = (ulong)uVar25;
            }
            if (ri->bits_per_channel == 0x10) {
              for (uVar51 = 0; uVar47 != uVar51; uVar51 = uVar51 + 1) {
                uVar5 = data[uVar51 * 4 + 3];
                if ((uVar5 != 0) && (uVar5 != 0xffff)) {
                  fVar60 = 1.0 / ((float)uVar5 / 65535.0);
                  fVar59 = (1.0 - fVar60) * 65535.0;
                  auVar61._0_4_ =
                       (int)(fVar59 + fVar60 * (float)(*(uint *)(data + uVar51 * 4) & 0xffff));
                  auVar61._4_4_ =
                       (int)(fVar59 + fVar60 * (float)(*(uint *)(data + uVar51 * 4) >> 0x10));
                  auVar61._8_4_ = (int)(fVar59 + fVar60 * 0.0);
                  auVar61._12_4_ = (int)(fVar59 + fVar60 * 0.0);
                  auVar61 = pshuflw(auVar61,auVar61,0xe8);
                  *(int *)(data + uVar51 * 4) = auVar61._0_4_;
                  data[uVar51 * 4 + 2] =
                       (stbi__uint16)(int)((float)data[uVar51 * 4 + 2] * fVar60 + fVar59);
                }
              }
            }
            else {
              for (uVar51 = 0; uVar47 != uVar51; uVar51 = uVar51 + 1) {
                bVar12 = *(byte *)((long)data + uVar51 * 4 + 3);
                if ((bVar12 != 0) && (bVar12 != 0xff)) {
                  fVar60 = 1.0 / ((float)bVar12 / 255.0);
                  fVar59 = (1.0 - fVar60) * 255.0;
                  *(char *)(data + uVar51 * 2) =
                       (char)(int)((float)(byte)data[uVar51 * 2] * fVar60 + fVar59);
                  *(char *)((long)data + uVar51 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)data + uVar51 * 4 + 1) * fVar60 + fVar59);
                  *(char *)(data + uVar51 * 2 + 1) =
                       (char)(int)((float)(byte)data[uVar51 * 2 + 1] * fVar60 + fVar59);
                }
              }
            }
          }
          if ((req_comp & 0xfffffffbU) != 0) {
            if (ri->bits_per_channel == 0x10) {
              data = stbi__convert_format16(data,4,req_comp,sVar18,sVar17);
            }
            else {
              data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,sVar18,sVar17);
            }
            if (data == (stbi__uint16 *)0x0) {
              return (void *)0x0;
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar17;
          *x = sVar18;
          return data;
        }
        goto LAB_001a01b0;
      }
    }
  }
  else {
    iVar16 = stbi__pic_is4(s,anon_var_dwarf_291d25);
    iVar21 = (int)psVar57;
    if (iVar16 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar16 = 0x54;
      while( true ) {
        iVar21 = (int)psVar57;
        bVar58 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if (bVar58) break;
        stbi__get8(s);
      }
      iVar16 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar16 != 0) {
        iVar16 = 0x5c;
        while (bVar58 = iVar16 != 0, iVar16 = iVar16 + -1, bVar58) {
          stbi__get8(s);
        }
        uVar23 = stbi__get16be(s);
        uVar24 = stbi__get16be(s);
        iVar16 = stbi__at_eof(s);
        if (iVar16 != 0) {
          lVar36 = *in_FS_OFFSET;
          pcVar35 = "bad file";
          goto LAB_0019e743;
        }
        iVar16 = stbi__mad3sizes_valid(uVar23,uVar24,4,0);
        if (iVar16 != 0) {
          stbi__get32be(s);
          stbi__get16be(s);
          stbi__get16be(s);
          psVar29 = (stbi__jpeg *)stbi__malloc_mad3(uVar23,uVar24,4,0);
          if (psVar29 != (stbi__jpeg *)0x0) {
            memset(psVar29,0xff,(ulong)(uVar23 * 4 * uVar24));
            psVar57 = pal[0] + 2;
            lVar36 = 0;
            uVar25 = uVar24;
            uVar26 = 0;
            do {
              if (lVar36 == 10) {
                *(char **)(*in_FS_OFFSET + -0x20) = "bad format";
                goto LAB_001a0b8c;
              }
              sVar9 = stbi__get8(s);
              bVar12 = stbi__get8(s);
              (*(stbi_uc (*) [4])(psVar57 + -2))[0] = bVar12;
              bVar11 = stbi__get8(s);
              psVar57[-1] = bVar11;
              bVar11 = stbi__get8(s);
              *psVar57 = bVar11;
              iVar16 = stbi__at_eof(s);
              uVar25 = uVar26;
              if (iVar16 != 0) {
                lVar36 = *in_FS_OFFSET;
                pcVar35 = "bad file";
LAB_001a0273:
                *(char **)(lVar36 + -0x20) = pcVar35;
                goto LAB_001a0b8c;
              }
              if (bVar12 != 8) {
                lVar36 = *in_FS_OFFSET;
                pcVar35 = "bad format";
                goto LAB_001a0273;
              }
              uVar26 = uVar26 | bVar11;
              psVar57 = psVar57 + 3;
              lVar36 = lVar36 + 1;
            } while (sVar9 != '\0');
            uVar25 = 4 - ((uVar26 & 0x10) == 0);
            if (comp != (int *)0x0) {
              *comp = uVar25;
            }
            for (uVar47 = 0; uVar47 != uVar24; uVar47 = uVar47 + 1) {
              psVar57 = psVar29->huff_dc[0].fast + (long)(int)(uVar23 * 4 * (int)uVar47) + -8;
              for (lVar31 = 0; lVar36 != lVar31; lVar31 = lVar31 + 1) {
                lVar6 = lVar31 * 3;
                sVar9 = pal[0][lVar6 + 1];
                psVar55 = psVar57;
                uVar26 = uVar23;
                if (sVar9 != '\0') {
                  if (sVar9 == '\x01') {
                    for (; 0 < (int)uVar26; uVar26 = uVar26 - (uVar53 & 0xff)) {
                      bVar12 = stbi__get8(s);
                      iVar16 = stbi__at_eof(s);
                      if (iVar16 != 0) goto LAB_001a0b64;
                      psVar30 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
                      if (psVar30 == (stbi_uc *)0x0) goto LAB_001a0b8c;
                      uVar53 = (uint)bVar12;
                      if (uVar26 < bVar12) {
                        uVar53 = uVar26;
                      }
                      uVar49 = uVar53 & 0xff;
                      while (bVar58 = uVar49 != 0, uVar49 = uVar49 - 1, bVar58) {
                        stbi__copyval((uint)pal[0][lVar6 + 2],psVar55,value);
                        psVar55 = psVar55 + 4;
                      }
                    }
                    goto LAB_0019f2b4;
                  }
                  if (sVar9 == '\x02') {
                    for (; 0 < (int)uVar26; uVar26 = uVar26 - iVar16) {
                      bVar12 = stbi__get8(s);
                      iVar16 = stbi__at_eof(s);
                      if (iVar16 != 0) goto LAB_001a0b64;
                      uVar53 = (uint)bVar12;
                      if ((char)bVar12 < '\0') {
                        if (uVar53 == 0x80) {
                          iVar16 = stbi__get16be(s);
                        }
                        else {
                          iVar16 = uVar53 - 0x7f;
                        }
                        if ((int)uVar26 < iVar16) goto LAB_001a0b64;
                        psVar30 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
                        iVar21 = iVar16;
                        if (psVar30 == (stbi_uc *)0x0) goto LAB_001a0b8c;
                        while (iVar21 != 0) {
                          stbi__copyval((uint)pal[0][lVar6 + 2],psVar55,value);
                          psVar55 = psVar55 + 4;
                          iVar21 = iVar21 + -1;
                        }
                      }
                      else {
                        iVar16 = bVar12 + 1;
                        iVar21 = iVar16;
                        if (uVar26 <= uVar53) goto LAB_001a0b64;
                        while (bVar58 = iVar21 != 0, iVar21 = iVar21 + -1, bVar58) {
                          psVar30 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar55);
                          if (psVar30 == (stbi_uc *)0x0) goto LAB_001a0b8c;
                          psVar55 = psVar55 + 4;
                        }
                      }
                    }
                    goto LAB_0019f2b4;
                  }
                  lVar36 = *in_FS_OFFSET;
                  pcVar35 = "bad format";
                  goto LAB_001a0b77;
                }
                while (bVar58 = uVar26 != 0, uVar26 = uVar26 - 1, bVar58) {
                  psVar30 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar55);
                  if (psVar30 == (stbi_uc *)0x0) goto LAB_001a0b8c;
                  psVar55 = psVar55 + 4;
                }
LAB_0019f2b4:
              }
            }
            goto LAB_001a0bae;
          }
          goto LAB_001a01b0;
        }
        goto LAB_001a0f5d;
      }
    }
    psVar29 = (stbi__jpeg *)malloc(0x4888);
    if (psVar29 == (stbi__jpeg *)0x0) {
      *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
    }
    else {
      psVar29->s = s;
      psVar29->idct_block_kernel = stbi__idct_simd;
      psVar29->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      psVar29->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
      iVar16 = stbi__decode_jpeg_header(psVar29,1);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      free(psVar29);
      if (iVar16 != 0) {
        psVar29 = (stbi__jpeg *)malloc(0x4888);
        if (psVar29 != (stbi__jpeg *)0x0) {
          psVar29->s = s;
          psVar29->idct_block_kernel = stbi__idct_simd;
          psVar29->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
          psVar29->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
          s->img_n = 0;
          if ((uint)req_comp < 5) {
            for (lVar36 = 0x46d8; lVar36 != 0x4858; lVar36 = lVar36 + 0x60) {
              psVar57 = psVar29->huff_dc[0].fast + lVar36 + -8;
              psVar57[0] = '\0';
              psVar57[1] = '\0';
              psVar57[2] = '\0';
              psVar57[3] = '\0';
              psVar57[4] = '\0';
              psVar57[5] = '\0';
              psVar57[6] = '\0';
              psVar57[7] = '\0';
              psVar57[8] = '\0';
              psVar57[9] = '\0';
              psVar57[10] = '\0';
              psVar57[0xb] = '\0';
              psVar57[0xc] = '\0';
              psVar57[0xd] = '\0';
              psVar57[0xe] = '\0';
              psVar57[0xf] = '\0';
            }
            psVar29->restart_interval = 0;
            iVar16 = stbi__decode_jpeg_header(psVar29,0);
            if (iVar16 != 0) {
              paVar1 = psVar29->img_comp;
              bVar12 = stbi__get_marker(psVar29);
LAB_0019f5af:
              if (bVar12 != 0xda) {
                if (bVar12 == 0xdc) {
                  iVar16 = stbi__get16be(psVar29->s);
                  sVar17 = stbi__get16be(psVar29->s);
                  if (iVar16 == 4) {
                    if (sVar17 == psVar29->s->img_y) goto LAB_0019f612;
                    pcVar35 = "bad DNL height";
                  }
                  else {
                    pcVar35 = "bad DNL len";
                  }
                  goto LAB_001a0faf;
                }
                if (bVar12 != 0xd9) {
                  iVar16 = stbi__process_marker(psVar29,(uint)bVar12);
                  if (iVar16 != 0) goto LAB_0019f612;
                  goto LAB_001a0fcd;
                }
                if (psVar29->progressive == 0) {
                  psVar41 = psVar29->s;
                  uVar23 = psVar41->img_n;
                }
                else {
                  lVar36 = 0;
                  while( true ) {
                    psVar41 = psVar29->s;
                    uVar23 = psVar41->img_n;
                    if ((int)uVar23 <= lVar36) break;
                    uVar23 = psVar29->img_comp[lVar36].x + 7 >> 3;
                    iVar16 = psVar29->img_comp[lVar36].y + 7 >> 3;
                    uVar51 = 0;
                    uVar47 = (ulong)uVar23;
                    if ((int)uVar23 < 1) {
                      uVar47 = uVar51;
                    }
                    if (iVar16 < 1) {
                      iVar16 = 0;
                    }
                    while (iVar21 = (int)uVar51, iVar21 != iVar16) {
                      for (uVar51 = 0; uVar51 != uVar47; uVar51 = uVar51 + 1) {
                        psVar56 = paVar1[lVar36].coeff;
                        iVar42 = paVar1[lVar36].coeff_w * iVar21;
                        iVar52 = paVar1[lVar36].tq;
                        iVar46 = iVar42 + (int)uVar51;
                        for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 1) {
                          psVar56[iVar46 * 0x40 + lVar31] =
                               psVar56[iVar46 * 0x40 + lVar31] * psVar29->dequant[iVar52][lVar31];
                        }
                        (*psVar29->idct_block_kernel)
                                  (paVar1[lVar36].data +
                                   uVar51 * 8 + (long)(iVar21 * 8 * paVar1[lVar36].w2),
                                   paVar1[lVar36].w2,psVar56 + (iVar42 + (int)uVar51) * 0x40);
                      }
                      uVar51 = (ulong)(iVar21 + 1);
                    }
                    lVar36 = lVar36 + 1;
                  }
                }
                uVar24 = (2 < (int)uVar23) + 1 + (uint)(2 < (int)uVar23);
                if (req_comp != 0) {
                  uVar24 = req_comp;
                }
                if (uVar23 == 3) {
                  bVar58 = true;
                  if (psVar29->rgb != 3) {
                    if (psVar29->app14_color_transform != 0) goto LAB_001a11d8;
                    bVar58 = psVar29->jfif == 0;
                  }
                }
                else {
LAB_001a11d8:
                  bVar58 = false;
                }
                uVar25 = 1;
                if (bVar58) {
                  uVar25 = uVar23;
                }
                if (2 < (int)uVar24) {
                  uVar25 = uVar23;
                }
                if (uVar23 != 3) {
                  uVar25 = uVar23;
                }
                if ((int)uVar25 < 1) goto LAB_001a0fcd;
                _value = (stbi_uc *)0x0;
                for (lVar36 = 0; (ulong)uVar25 * 0x30 != lVar36; lVar36 = lVar36 + 0x30) {
                  pvVar28 = malloc((ulong)(psVar41->img_x + 3));
                  *(void **)((long)&psVar29->img_comp[0].linebuf + lVar36 * 2) = pvVar28;
                  if (pvVar28 == (void *)0x0) goto LAB_001a1bc9;
                  uVar47 = (long)psVar29->img_h_max /
                           (long)*(int *)((long)&psVar29->img_comp[0].h + lVar36 * 2);
                  iVar16 = (int)uVar47;
                  *(int *)(pal[6] + lVar36) = iVar16;
                  iVar21 = psVar29->img_v_max / *(int *)((long)&psVar29->img_comp[0].v + lVar36 * 2)
                  ;
                  *(int *)(pal[7] + lVar36) = iVar21;
                  *(int *)(pal[9] + lVar36) = iVar21 >> 1;
                  *(int *)(pal[8] + lVar36) =
                       (int)((ulong)((psVar41->img_x + iVar16) - 1) / (uVar47 & 0xffffffff));
                  psVar57 = pal[10] + lVar36;
                  psVar57[0] = '\0';
                  psVar57[1] = '\0';
                  psVar57[2] = '\0';
                  psVar57[3] = '\0';
                  uVar34 = *(undefined8 *)((long)&psVar29->img_comp[0].data + lVar36 * 2);
                  *(undefined8 *)(pal[4] + lVar36) = uVar34;
                  *(undefined8 *)(pal[2] + lVar36) = uVar34;
                  if (iVar16 == 2) {
                    pcVar33 = stbi__resample_row_h_2;
                    if (iVar21 != 1) {
                      if (iVar21 != 2) goto LAB_001a1301;
                      pcVar33 = psVar29->resample_row_hv_2_kernel;
                    }
                  }
                  else if (iVar16 == 1) {
                    pcVar33 = stbi__resample_row_generic;
                    if (iVar21 == 2) {
                      pcVar33 = stbi__resample_row_v_2;
                    }
                    if (iVar21 == 1) {
                      pcVar33 = resample_row_1;
                    }
                  }
                  else {
LAB_001a1301:
                    pcVar33 = stbi__resample_row_generic;
                  }
                  *(code **)(pal[0] + lVar36) = pcVar33;
                }
                sVar17 = psVar41->img_y;
                local_8980 = (stbi__context *)stbi__malloc_mad3(uVar24,psVar41->img_x,sVar17,1);
                if (local_8980 != (stbi__context *)0x0) {
                  iVar16 = 0;
                  uVar23 = 0;
                  do {
                    if (sVar17 <= uVar23) {
                      stbi__cleanup_jpeg(psVar29);
                      psVar41 = psVar29->s;
                      *x = psVar41->img_x;
                      *y = psVar41->img_y;
                      if (comp != (int *)0x0) {
                        *comp = (uint)(2 < psVar41->img_n) * 2 + 1;
                      }
                      goto LAB_0019eb5c;
                    }
                    sVar17 = psVar41->img_x;
                    psVar57 = value;
                    for (lVar36 = 0; (ulong)uVar25 * 0x30 != lVar36; lVar36 = lVar36 + 0x30) {
                      iVar21 = *(int *)(pal[9] + lVar36);
                      iVar52 = *(int *)(pal[7] + lVar36);
                      iVar42 = iVar52 >> 1;
                      psVar55 = pal[4] + lVar36;
                      if (iVar21 < iVar42) {
                        psVar55 = pal[2] + lVar36;
                      }
                      psVar30 = pal[4] + lVar36;
                      if (iVar42 <= iVar21) {
                        psVar30 = pal[2] + lVar36;
                      }
                      uVar34 = (**(code **)(pal[0] + lVar36))
                                         (*(undefined8 *)
                                           ((long)&psVar29->img_comp[0].linebuf + lVar36 * 2),
                                          *(undefined8 *)psVar55,*(undefined8 *)psVar30,
                                          *(undefined4 *)(pal[8] + lVar36));
                      *(undefined8 *)psVar57 = uVar34;
                      *(int *)(pal[9] + lVar36) = iVar21 + 1;
                      if (iVar52 <= iVar21 + 1) {
                        psVar55 = pal[9] + lVar36;
                        psVar55[0] = '\0';
                        psVar55[1] = '\0';
                        psVar55[2] = '\0';
                        psVar55[3] = '\0';
                        lVar31 = *(long *)(pal[4] + lVar36);
                        *(long *)(pal[2] + lVar36) = lVar31;
                        iVar21 = *(int *)(pal[10] + lVar36) + 1;
                        *(int *)(pal[10] + lVar36) = iVar21;
                        if (iVar21 < *(int *)((long)&psVar29->img_comp[0].y + lVar36 * 2)) {
                          *(long *)(pal[4] + lVar36) =
                               lVar31 + *(int *)((long)&psVar29->img_comp[0].w2 + lVar36 * 2);
                        }
                      }
                      psVar57 = psVar57 + 8;
                    }
                    if ((int)uVar24 < 3) {
                      psVar41 = psVar29->s;
                      if (bVar58) {
                        uVar47 = (ulong)(sVar17 * iVar16);
                        if (uVar24 == 1) {
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            pbVar45[(long)(local_8980->buffer_start + (uVar47 - 0x38))] =
                                 (byte)((uint)*pbVar45 * 0x1d +
                                        (uint)*pbVar45 * 0x96 + (uint)_value[(long)pbVar45] * 0x4d
                                       >> 8);
                          }
                        }
                        else {
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            local_8980->buffer_start[(long)pbVar45 * 2 + uVar47 + -0x38] =
                                 (stbi_uc)((uint)*pbVar45 * 0x1d +
                                           (uint)*pbVar45 * 0x96 +
                                           (uint)_value[(long)pbVar45] * 0x4d >> 8);
                            local_8980->buffer_start[(long)pbVar45 * 2 + uVar47 + -0x37] = 0xff;
                          }
                        }
                      }
                      else if (psVar41->img_n == 4) {
                        if (psVar29->app14_color_transform == 2) {
                          psVar57 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x37);
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            iVar21 = (_value[(long)pbVar45] ^ 0xff) * (uint)*pbVar45;
                            psVar57[-1] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            *psVar57 = 0xff;
                            psVar57 = psVar57 + uVar24;
                          }
                        }
                        else {
                          if (psVar29->app14_color_transform != 0) goto LAB_001a1936;
                          psVar57 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x37);
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            bVar12 = *pbVar45;
                            iVar21 = (uint)_value[(long)pbVar45] * (uint)bVar12;
                            iVar52 = (uint)*pbVar45 * (uint)bVar12;
                            psVar57[-1] = (char)((((uint)*pbVar45 * (uint)bVar12 + 0x80 >> 8) +
                                                  (uint)*pbVar45 * (uint)bVar12 + 0x80 >> 8) * 0x1d
                                                 + (iVar52 + (iVar52 + 0x80U >> 8) + 0x80 >> 8) *
                                                   0x96 + (iVar21 + (iVar21 + 0x80U >> 8) + 0x80 >>
                                                          8) * 0x4d >> 8);
                            *psVar57 = 0xff;
                            psVar57 = psVar57 + uVar24;
                          }
                        }
                      }
                      else {
LAB_001a1936:
                        if (uVar24 == 1) {
                          for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                            local_8980->buffer_start[uVar47 + sVar17 * iVar16 + -0x38] =
                                 _value[uVar47];
                          }
                        }
                        else {
                          for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                            local_8980->buffer_start[uVar47 * 2 + (ulong)(sVar17 * iVar16) + -0x38]
                                 = _value[uVar47];
                            local_8980->buffer_start[uVar47 * 2 + (ulong)(sVar17 * iVar16) + -0x37]
                                 = 0xff;
                          }
                        }
                      }
                    }
                    else {
                      psVar57 = local_8980->buffer_start +
                                ((ulong)(uVar23 * uVar24 * sVar17) - 0x38);
                      psVar41 = psVar29->s;
                      if (psVar41->img_n == 3) {
                        if (bVar58) {
                          psVar57 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x35);
                          for (puVar43 = (undefined1 *)0x0;
                              puVar43 < (undefined1 *)(ulong)psVar41->img_x; puVar43 = puVar43 + 1)
                          {
                            psVar57[-3] = _value[(long)puVar43];
                            psVar57[-2] = *puVar43;
                            psVar57[-1] = *puVar43;
                            *psVar57 = 0xff;
                            psVar57 = psVar57 + uVar24;
                          }
                        }
                        else {
                          (*psVar29->YCbCr_to_RGB_kernel)
                                    (psVar57,_value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar41->img_x,
                                     uVar24);
                        }
                      }
                      else if (psVar41->img_n == 4) {
                        if (psVar29->app14_color_transform == 2) {
                          (*psVar29->YCbCr_to_RGB_kernel)
                                    (psVar57,_value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar41->img_x,
                                     uVar24);
                          psVar41 = psVar29->s;
                          psVar57 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x36);
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            bVar12 = *pbVar45;
                            iVar21 = (psVar57[-2] ^ 0xff) * (uint)bVar12;
                            psVar57[-2] = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            iVar21 = (psVar57[-1] ^ 0xff) * (uint)bVar12;
                            psVar57[-1] = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            iVar21 = (*psVar57 ^ 0xff) * (uint)bVar12;
                            *psVar57 = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            psVar57 = psVar57 + uVar24;
                          }
                        }
                        else if (psVar29->app14_color_transform == 0) {
                          psVar57 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x35);
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            bVar12 = *pbVar45;
                            iVar21 = (uint)_value[(long)pbVar45] * (uint)bVar12;
                            psVar57[-3] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            iVar21 = (uint)*pbVar45 * (uint)bVar12;
                            psVar57[-2] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            psVar57[-1] = (char)(((uint)*pbVar45 * (uint)bVar12 + 0x80 >> 8) +
                                                 (uint)*pbVar45 * (uint)bVar12 + 0x80 >> 8);
                            *psVar57 = 0xff;
                            psVar57 = psVar57 + uVar24;
                          }
                        }
                        else {
                          (*psVar29->YCbCr_to_RGB_kernel)
                                    (psVar57,_value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar41->img_x,
                                     uVar24);
                        }
                      }
                      else {
                        psVar57 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x35);
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          sVar9 = _value[uVar47];
                          psVar57[-1] = sVar9;
                          psVar57[-2] = sVar9;
                          psVar57[-3] = sVar9;
                          *psVar57 = 0xff;
                          psVar57 = psVar57 + uVar24;
                        }
                      }
                    }
                    uVar23 = uVar23 + 1;
                    psVar41 = psVar29->s;
                    sVar17 = psVar41->img_y;
                    iVar16 = iVar16 + uVar24;
                  } while( true );
                }
LAB_001a1bc9:
                stbi__cleanup_jpeg(psVar29);
                *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
                local_8980 = (stbi__context *)0x0;
                goto LAB_0019eb5c;
              }
              iVar16 = stbi__get16be(psVar29->s);
              bVar12 = stbi__get8(psVar29->s);
              uVar23 = (uint)bVar12;
              psVar29->scan_n = (uint)bVar12;
              if (((byte)(bVar12 - 5) < 0xfc) ||
                 (psVar41 = psVar29->s, psVar41->img_n < (int)(uint)bVar12)) {
                pcVar35 = "bad SOS component count";
              }
              else {
                if (iVar16 == (uint)bVar12 * 2 + 6) {
                  lVar36 = 0;
                  while( true ) {
                    bVar12 = stbi__get8(psVar41);
                    if ((int)uVar23 <= lVar36) break;
                    bVar11 = stbi__get8(psVar29->s);
                    psVar41 = psVar29->s;
                    uVar23 = psVar41->img_n;
                    uVar47 = 0;
                    if (0 < (int)uVar23) {
                      uVar47 = (ulong)uVar23;
                    }
                    paVar44 = paVar1;
                    for (uVar51 = 0; uVar47 != uVar51; uVar51 = uVar51 + 1) {
                      if (paVar44->id == (uint)bVar12) {
                        uVar47 = uVar51 & 0xffffffff;
                        break;
                      }
                      paVar44 = paVar44 + 1;
                    }
                    if ((uint)uVar47 == uVar23) goto LAB_001a0fcd;
                    psVar29->img_comp[uVar47].hd = (uint)(bVar11 >> 4);
                    if (0x3f < bVar11) {
                      pcVar35 = "bad DC huff";
                      goto LAB_001a0faf;
                    }
                    paVar1[uVar47].ha = bVar11 & 0xf;
                    if (3 < (bVar11 & 0xf)) {
                      pcVar35 = "bad AC huff";
                      goto LAB_001a0faf;
                    }
                    psVar29->order[lVar36] = (uint)uVar47;
                    lVar36 = lVar36 + 1;
                    uVar23 = psVar29->scan_n;
                  }
                  psVar29->spec_start = (uint)bVar12;
                  bVar12 = stbi__get8(psVar29->s);
                  psVar29->spec_end = (uint)bVar12;
                  bVar12 = stbi__get8(psVar29->s);
                  psVar29->succ_high = (uint)(bVar12 >> 4);
                  psVar29->succ_low = bVar12 & 0xf;
                  iVar16 = psVar29->spec_start;
                  if (psVar29->progressive == 0) {
                    if (((iVar16 == 0) && (bVar12 < 0x10)) && ((bVar12 & 0xf) == 0)) {
                      psVar29->spec_end = 0x3f;
                      goto LAB_0019f7ab;
                    }
                  }
                  else if (((iVar16 < 0x40) && (psVar29->spec_end < 0x40)) &&
                          ((iVar16 <= psVar29->spec_end &&
                           ((bVar12 < 0xe0 && ((bVar12 & 0xf) < 0xe)))))) {
LAB_0019f7ab:
                    stbi__jpeg_reset(psVar29);
                    if (psVar29->progressive == 0) {
                      if (psVar29->scan_n == 1) {
                        iVar16 = psVar29->order[0];
                        uVar23 = psVar29->img_comp[iVar16].x + 7 >> 3;
                        iVar21 = psVar29->img_comp[iVar16].y + 7 >> 3;
                        if ((int)uVar23 < 1) {
                          uVar23 = 0;
                        }
                        iVar52 = 0;
                        if (iVar21 < 1) {
                          iVar21 = 0;
                        }
                        for (iVar42 = 0; iVar42 != iVar21; iVar42 = iVar42 + 1) {
                          for (lVar36 = 0; (ulong)uVar23 * 8 != lVar36; lVar36 = lVar36 + 8) {
                            iVar46 = stbi__jpeg_decode_block
                                               (psVar29,(short *)pal,
                                                (stbi__huffman *)
                                                psVar29->huff_dc[paVar1[iVar16].hd].fast,
                                                (stbi__huffman *)
                                                psVar29->huff_ac[paVar1[iVar16].ha].fast,
                                                psVar29->fast_ac[paVar1[iVar16].ha],iVar16,
                                                psVar29->dequant[paVar1[iVar16].tq]);
                            if (iVar46 == 0) {
                              bVar58 = false;
                              goto LAB_001a0050;
                            }
                            (*psVar29->idct_block_kernel)
                                      (paVar1[iVar16].data + lVar36 + iVar52 * paVar1[iVar16].w2,
                                       paVar1[iVar16].w2,(short *)pal);
                            iVar46 = psVar29->todo;
                            psVar29->todo = iVar46 + -1;
                            if (iVar46 < 2) {
                              if (psVar29->code_bits < 0x18) {
                                stbi__grow_buffer_unsafe(psVar29);
                              }
                              if ((psVar29->marker & 0xf8) != 0xd0) goto LAB_001a004d;
                              stbi__jpeg_reset(psVar29);
                            }
                          }
                          iVar52 = iVar52 + 8;
                        }
LAB_001a004d:
                        bVar58 = true;
                      }
                      else {
                        for (iVar16 = 0; iVar16 < psVar29->img_mcu_y; iVar16 = iVar16 + 1) {
                          for (iVar21 = 0; iVar21 < psVar29->img_mcu_x; iVar21 = iVar21 + 1) {
                            for (lVar36 = 0; lVar36 < psVar29->scan_n; lVar36 = lVar36 + 1) {
                              iVar52 = psVar29->order[lVar36];
                              for (iVar42 = 0; iVar42 < paVar1[iVar52].v; iVar42 = iVar42 + 1) {
                                for (iVar46 = 0; iVar50 = paVar1[iVar52].h, iVar46 < iVar50;
                                    iVar46 = iVar46 + 1) {
                                  iVar27 = paVar1[iVar52].v;
                                  iVar22 = stbi__jpeg_decode_block
                                                     (psVar29,(short *)pal,
                                                      (stbi__huffman *)
                                                      psVar29->huff_dc[paVar1[iVar52].hd].fast,
                                                      (stbi__huffman *)
                                                      psVar29->huff_ac[paVar1[iVar52].ha].fast,
                                                      psVar29->fast_ac[paVar1[iVar52].ha],iVar52,
                                                      psVar29->dequant[paVar1[iVar52].tq]);
                                  if (iVar22 == 0) {
                                    bVar58 = false;
                                    goto LAB_001a0050;
                                  }
                                  (*psVar29->idct_block_kernel)
                                            (paVar1[iVar52].data +
                                             (long)((iVar50 * iVar21 + iVar46) * 8) +
                                             (long)((iVar27 * iVar16 + iVar42) * paVar1[iVar52].w2 *
                                                   8),paVar1[iVar52].w2,(short *)pal);
                                }
                              }
                            }
                            iVar52 = psVar29->todo;
                            psVar29->todo = iVar52 + -1;
                            if (iVar52 < 2) {
                              if (psVar29->code_bits < 0x18) {
                                stbi__grow_buffer_unsafe(psVar29);
                              }
                              if ((psVar29->marker & 0xf8) != 0xd0) goto LAB_001a00a6;
                              stbi__jpeg_reset(psVar29);
                            }
                          }
                        }
LAB_001a00a6:
                        bVar58 = true;
                      }
LAB_001a0050:
                      if (!bVar58) goto LAB_001a0fcd;
                    }
                    else if (psVar29->scan_n == 1) {
                      iVar16 = psVar29->order[0];
                      iVar52 = psVar29->img_comp[iVar16].x + 7 >> 3;
                      iVar21 = psVar29->img_comp[iVar16].y + 7 >> 3;
                      iVar42 = 0;
                      if (iVar52 < 1) {
                        iVar52 = 0;
                      }
                      if (iVar21 < 1) {
                        iVar21 = iVar42;
                      }
                      for (; iVar42 != iVar21; iVar42 = iVar42 + 1) {
                        for (iVar46 = 0; iVar46 != iVar52; iVar46 = iVar46 + 1) {
                          psVar56 = paVar1[iVar16].coeff +
                                    (paVar1[iVar16].coeff_w * iVar42 + iVar46) * 0x40;
                          uVar47 = (ulong)psVar29->spec_start;
                          if (uVar47 == 0) {
                            iVar50 = stbi__jpeg_decode_block_prog_dc
                                               (psVar29,psVar56,
                                                (stbi__huffman *)
                                                psVar29->huff_dc[paVar1[iVar16].hd].fast,iVar16);
                            if (iVar50 == 0) goto LAB_001a0fcd;
                          }
                          else {
                            iVar50 = paVar1[iVar16].ha;
                            psVar57 = psVar29->huff_ac[iVar50].fast;
                            iVar27 = psVar29->eob_run;
                            bVar12 = (byte)psVar29->succ_low;
                            if (psVar29->succ_high == 0) {
                              if (iVar27 == 0) {
                                do {
                                  if (psVar29->code_bits < 0x10) {
                                    stbi__grow_buffer_unsafe(psVar29);
                                  }
                                  sVar37 = psVar29->fast_ac[iVar50][psVar29->code_buffer >> 0x17];
                                  uVar23 = (uint)sVar37;
                                  iVar27 = (int)uVar47;
                                  if (sVar37 == 0) {
                                    uVar23 = stbi__jpeg_huff_decode
                                                       (psVar29,(stbi__huffman *)psVar57);
                                    if ((int)uVar23 < 0) goto LAB_001a0be6;
                                    uVar24 = uVar23 >> 4;
                                    if ((uVar23 & 0xf) == 0) {
                                      if (uVar23 < 0xf0) {
                                        iVar27 = 1 << ((byte)uVar24 & 0x1f);
                                        psVar29->eob_run = iVar27;
                                        if (0xf < uVar23) {
                                          iVar27 = stbi__jpeg_get_bits(psVar29,uVar24);
                                          iVar27 = iVar27 + psVar29->eob_run;
                                        }
                                        goto LAB_0019f955;
                                      }
                                      uVar47 = (ulong)(iVar27 + 0x10);
                                    }
                                    else {
                                      lVar36 = (ulong)uVar24 + (long)iVar27;
                                      uVar47 = (ulong)((int)lVar36 + 1);
                                      bVar11 = ""[lVar36];
                                      iVar27 = stbi__extend_receive(psVar29,uVar23 & 0xf);
                                      psVar56[bVar11] = (short)(iVar27 << (bVar12 & 0x1f));
                                    }
                                  }
                                  else {
                                    lVar36 = (ulong)(uVar23 >> 4 & 0xf) + (long)iVar27;
                                    psVar29->code_buffer =
                                         psVar29->code_buffer << (sbyte)(uVar23 & 0xf);
                                    psVar29->code_bits = psVar29->code_bits - (uVar23 & 0xf);
                                    uVar47 = (ulong)((int)lVar36 + 1);
                                    psVar56[""[lVar36]] = (short)((uVar23 >> 8) << (bVar12 & 0x1f));
                                  }
                                } while ((int)uVar47 <= psVar29->spec_end);
                              }
                              else {
LAB_0019f955:
                                psVar29->eob_run = iVar27 + -1;
                              }
                            }
                            else if (iVar27 == 0) {
                              iVar50 = 0x10000 << (bVar12 & 0x1f);
                              do {
                                uVar23 = stbi__jpeg_huff_decode(psVar29,(stbi__huffman *)psVar57);
                                if ((int)uVar23 < 0) goto LAB_001a0be6;
                                uVar24 = uVar23 >> 4;
                                if ((uVar23 & 0xf) == 1) {
                                  iVar27 = stbi__jpeg_get_bit(psVar29);
                                  iVar22 = 1;
                                  if (iVar27 == 0) {
                                    iVar22 = 0xffff;
                                  }
                                  sVar37 = (short)(iVar22 << (bVar12 & 0x1f));
                                }
                                else {
                                  if ((uVar23 & 0xf) != 0) goto LAB_001a0be6;
                                  if (uVar23 < 0xf0) {
                                    psVar29->eob_run = ~(-1 << ((byte)uVar24 & 0x1f));
                                    if (0xf < uVar23) {
                                      iVar27 = stbi__jpeg_get_bits(psVar29,uVar24);
                                      psVar29->eob_run = psVar29->eob_run + iVar27;
                                    }
                                    uVar24 = 0x40;
                                  }
                                  else {
                                    uVar24 = 0xf;
                                  }
                                  sVar37 = 0;
                                }
                                uVar51 = (long)(int)uVar47;
                                do {
                                  while( true ) {
                                    uVar47 = uVar51;
                                    iVar27 = psVar29->spec_end;
                                    if ((long)iVar27 < (long)uVar47) goto LAB_0019fa8b;
                                    bVar11 = ""[uVar47];
                                    if (psVar56[bVar11] == 0) break;
                                    iVar27 = stbi__jpeg_get_bit(psVar29);
                                    if ((iVar27 != 0) &&
                                       (sVar4 = psVar56[bVar11], (iVar50 >> 0x10 & (int)sVar4) == 0)
                                       ) {
                                      sVar7 = (short)((uint)iVar50 >> 0x10);
                                      if (sVar4 < 1) {
                                        sVar7 = -sVar7;
                                      }
                                      psVar56[bVar11] = sVar4 + sVar7;
                                    }
                                    uVar51 = uVar47 + 1;
                                  }
                                  bVar58 = uVar24 != 0;
                                  uVar24 = uVar24 - 1;
                                  uVar51 = uVar47 + 1;
                                } while (bVar58);
                                psVar56[bVar11] = sVar37;
                                iVar27 = psVar29->spec_end;
                                uVar47 = uVar47 + 1;
LAB_0019fa8b:
                              } while ((int)uVar47 <= iVar27);
                            }
                            else {
                              psVar29->eob_run = iVar27 + -1;
                              uVar23 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                              for (; (long)uVar47 <= (long)psVar29->spec_end; uVar47 = uVar47 + 1) {
                                bVar12 = ""[uVar47];
                                if (((psVar56[bVar12] != 0) &&
                                    (iVar50 = stbi__jpeg_get_bit(psVar29), iVar50 != 0)) &&
                                   (sVar37 = psVar56[bVar12], (uVar23 & (int)sVar37) == 0)) {
                                  uVar24 = -uVar23;
                                  if (0 < sVar37) {
                                    uVar24 = uVar23;
                                  }
                                  psVar56[bVar12] = (short)uVar24 + sVar37;
                                }
                              }
                            }
                          }
                          iVar50 = psVar29->todo;
                          psVar29->todo = iVar50 + -1;
                          if (iVar50 < 2) {
                            if (psVar29->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar29);
                            }
                            bVar12 = psVar29->marker;
                            if ((bVar12 & 0xf8) != 0xd0) goto LAB_001a005f;
                            stbi__jpeg_reset(psVar29);
                          }
                        }
                      }
                    }
                    else {
                      for (iVar16 = 0; iVar16 < psVar29->img_mcu_y; iVar16 = iVar16 + 1) {
                        for (iVar21 = 0; iVar21 < psVar29->img_mcu_x; iVar21 = iVar21 + 1) {
                          for (lVar36 = 0; lVar36 < psVar29->scan_n; lVar36 = lVar36 + 1) {
                            iVar52 = psVar29->order[lVar36];
                            for (iVar42 = 0; iVar42 < paVar1[iVar52].v; iVar42 = iVar42 + 1) {
                              iVar46 = 0;
                              while (iVar46 < paVar1[iVar52].h) {
                                iVar50 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar29,paVar1[iVar52].coeff +
                                                            (paVar1[iVar52].h * iVar21 + iVar46 +
                                                            (paVar1[iVar52].v * iVar16 + iVar42) *
                                                            paVar1[iVar52].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    psVar29->huff_dc[paVar1[iVar52].hd].fast,iVar52)
                                ;
                                iVar46 = iVar46 + 1;
                                if (iVar50 == 0) goto LAB_001a0fcd;
                              }
                            }
                          }
                          iVar52 = psVar29->todo;
                          psVar29->todo = iVar52 + -1;
                          if (iVar52 < 2) {
                            if (psVar29->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar29);
                            }
                            bVar12 = psVar29->marker;
                            if ((bVar12 & 0xf8) != 0xd0) goto LAB_001a005f;
                            stbi__jpeg_reset(psVar29);
                          }
                        }
                      }
                    }
                    bVar12 = psVar29->marker;
LAB_001a005f:
                    if (bVar12 == 0xff) {
                      do {
                        iVar16 = stbi__at_eof(psVar29->s);
                        if (iVar16 != 0) goto LAB_0019f612;
                        sVar9 = stbi__get8(psVar29->s);
                      } while (sVar9 != 0xff);
                      sVar9 = stbi__get8(psVar29->s);
                      psVar29->marker = sVar9;
                    }
                    goto LAB_0019f612;
                  }
                  pcVar35 = "bad SOS";
                  goto LAB_001a0faf;
                }
                pcVar35 = "bad SOS len";
              }
LAB_001a0faf:
              *(char **)(*in_FS_OFFSET + -0x20) = pcVar35;
            }
LAB_001a0fcd:
            stbi__cleanup_jpeg(psVar29);
          }
          else {
            *(char **)(*in_FS_OFFSET + -0x20) = "bad req_comp";
          }
          local_8980 = (stbi__context *)0x0;
          goto LAB_0019eb5c;
        }
        goto LAB_001a01b0;
      }
    }
    sVar9 = stbi__get8(s);
    sVar10 = stbi__get8(s);
    if ((sVar9 != 'P') || ((byte)(sVar10 - 0x37) < 0xfe)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar16 = stbi__hdr_test(s);
      if (iVar16 != 0) {
        psVar29 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        if (psVar29 == (stbi__jpeg *)0x0) {
          return (void *)0x0;
        }
        iVar16 = *x;
        iVar21 = *y;
        local_8980 = (stbi__context *)stbi__malloc_mad3(iVar16,iVar21,req_comp,0);
        if (local_8980 != (stbi__context *)0x0) {
          uVar24 = (req_comp + (req_comp & 1U)) - 1;
          uVar23 = iVar21 * iVar16;
          uVar47 = (ulong)uVar24;
          if ((int)uVar24 < 1) {
            uVar47 = 0;
          }
          lVar36 = (long)req_comp;
          uVar51 = (ulong)uVar23;
          if ((int)uVar23 < 1) {
            uVar51 = 0;
          }
          psVar41 = local_8980;
          psVar39 = psVar29;
          for (uVar54 = 0; uVar54 != uVar51; uVar54 = uVar54 + 1) {
            for (uVar40 = 0; uVar47 != uVar40; uVar40 = uVar40 + 1) {
              fVar59 = powf(*(float *)(psVar39->huff_dc[0].fast + uVar40 * 4 + -8) *
                            stbi__h2l_scale_i,stbi__h2l_gamma_i);
              fVar60 = fVar59 * 255.0 + 0.5;
              fVar59 = 0.0;
              if (0.0 <= fVar60) {
                fVar59 = fVar60;
              }
              fVar60 = 255.0;
              if (fVar59 <= 255.0) {
                fVar60 = fVar59;
              }
              psVar41->buffer_start[uVar40 - 0x38] = (stbi_uc)(int)fVar60;
            }
            if ((int)uVar47 < req_comp) {
              lVar31 = uVar54 * lVar36 + uVar47;
              fVar60 = *(float *)(psVar29->huff_dc[0].fast + lVar31 * 4 + -8) * 255.0 + 0.5;
              fVar59 = 0.0;
              if (0.0 <= fVar60) {
                fVar59 = fVar60;
              }
              fVar60 = 255.0;
              if (fVar59 <= 255.0) {
                fVar60 = fVar59;
              }
              local_8980->buffer_start[lVar31 + -0x38] = (stbi_uc)(int)fVar60;
            }
            psVar41 = (stbi__context *)(psVar41->buffer_start + lVar36 + -0x38);
            psVar39 = (stbi__jpeg *)(psVar39->huff_dc[0].fast + lVar36 * 4 + -8);
          }
LAB_0019eb5c:
          free(psVar29);
          return local_8980;
        }
LAB_001a01ab:
        free(psVar29);
        goto LAB_001a01b0;
      }
      stbi__get8(s);
      bVar12 = stbi__get8(s);
      if (bVar12 < 2) {
        bVar11 = stbi__get8(s);
        if (bVar12 == 1) {
          if ((bVar11 & 0xf7) == 1) {
            iVar16 = 4;
            stbi__skip(s,4);
            bVar11 = stbi__get8(s);
            if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0))
            goto LAB_001a01d6;
          }
          goto LAB_001a00bf;
        }
        if ((bVar11 & 0xf6) != 2) goto LAB_001a00bf;
        iVar16 = 9;
LAB_001a01d6:
        stbi__skip(s,iVar16);
        iVar16 = stbi__get16le(s);
        if ((iVar16 == 0) || (iVar16 = stbi__get16le(s), iVar16 == 0)) goto LAB_001a00bf;
        bVar11 = stbi__get8(s);
        if (bVar12 != 1) {
          if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) {
            s->img_buffer = s->img_buffer_original;
            s->img_buffer_end = s->img_buffer_original_end;
            goto LAB_001a0aa8;
          }
          goto LAB_001a00bf;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if ((bVar11 - 8 & 0xf7) == 0) {
LAB_001a0aa8:
          bVar11 = stbi__get8(s);
          sVar9 = stbi__get8(s);
          bVar13 = stbi__get8(s);
          iVar16 = stbi__get16le(s);
          uVar26 = stbi__get16le(s);
          bVar12 = stbi__get8(s);
          stbi__get16le(s);
          stbi__get16le(s);
          uVar23 = stbi__get16le(s);
          uVar24 = stbi__get16le(s);
          bVar14 = stbi__get8(s);
          pal._0_8_ = (ulong)(uint)pal[1] << 0x20;
          bVar15 = stbi__get8(s);
          _value = (stbi_uc *)((ulong)_value & 0xffffffff00000000);
          if (sVar9 == '\0') {
            uVar25 = bVar13 - 8;
            if (bVar13 < 8) {
              uVar25 = (uint)bVar13;
            }
            uVar25 = (uint)(uVar25 == 3);
            bVar12 = bVar14;
          }
          else {
            uVar25 = 0;
          }
          uVar25 = stbi__tga_get_comp((uint)bVar12,uVar25,(int *)pal);
          if (uVar25 == 0) {
            lVar36 = *in_FS_OFFSET;
            pcVar35 = "bad format";
            goto LAB_0019e743;
          }
          *x = uVar23;
          *y = uVar24;
          if (comp != (int *)0x0) {
            *comp = uVar25;
          }
          iVar21 = stbi__mad3sizes_valid(uVar23,uVar24,uVar25,0);
          if (iVar21 == 0) goto LAB_001a0f5d;
          psVar29 = (stbi__jpeg *)stbi__malloc_mad3(uVar23,uVar24,uVar25,0);
          if (psVar29 == (stbi__jpeg *)0x0) goto LAB_001a01b0;
          stbi__skip(s,(uint)bVar11);
          uVar47 = (ulong)uVar25;
          if (((sVar9 == '\0') && (bVar13 < 8)) && (pal[0] == (stbi_uc  [4])0x0)) {
            uVar53 = 0;
            uVar26 = uVar24;
            while (uVar26 = uVar26 - 1, uVar26 != 0xffffffff) {
              uVar49 = uVar53;
              if ((bVar15 >> 5 & 1) == 0) {
                uVar49 = uVar26;
              }
              stbi__getn(s,psVar29->huff_dc[0].fast + (long)(int)(uVar49 * uVar25 * uVar23) + -8,
                         uVar25 * uVar23);
              uVar53 = uVar53 + 1;
            }
          }
          else {
            if (sVar9 == '\0') {
              local_8938 = (stbi__jpeg *)0x0;
            }
            else {
              if (uVar26 == 0) {
LAB_001a1e37:
                free(psVar29);
                lVar36 = *in_FS_OFFSET;
                pcVar35 = "bad palette";
                goto LAB_0019e743;
              }
              stbi__skip(s,iVar16);
              local_8938 = (stbi__jpeg *)stbi__malloc_mad2(uVar26,uVar25,0);
              if (local_8938 == (stbi__jpeg *)0x0) goto LAB_001a01ab;
              psVar39 = local_8938;
              uVar53 = uVar26;
              if (pal[0] == (stbi_uc  [4])0x0) {
                iVar16 = stbi__getn(s,(stbi_uc *)local_8938,uVar25 * uVar26);
                if (iVar16 == 0) {
                  free(psVar29);
                  psVar29 = local_8938;
                  goto LAB_001a1e37;
                }
              }
              else {
                while (uVar53 != 0) {
                  stbi__tga_read_rgb16(s,(stbi_uc *)psVar39);
                  psVar39 = (stbi__jpeg *)(psVar39->huff_dc[0].fast + (uVar47 - 8));
                  uVar53 = uVar53 - 1;
                }
              }
            }
            bVar58 = true;
            iVar16 = 0;
            uVar53 = 0;
            psVar39 = psVar29;
            for (uVar51 = 0; uVar51 != uVar24 * uVar23; uVar51 = uVar51 + 1) {
              if (bVar13 < 8) {
LAB_001a1c84:
                if (sVar9 == '\0') {
                  if (pal[0] == (stbi_uc  [4])0x0) {
                    for (uVar54 = 0; uVar47 != uVar54; uVar54 = uVar54 + 1) {
                      sVar10 = stbi__get8(s);
                      value[uVar54] = sVar10;
                    }
                  }
                  else {
                    stbi__tga_read_rgb16(s,value);
                  }
                }
                else {
                  if (bVar14 == 8) {
                    bVar12 = stbi__get8(s);
                    uVar49 = (uint)bVar12;
                  }
                  else {
                    uVar49 = stbi__get16le(s);
                  }
                  if (uVar26 <= uVar49) {
                    uVar49 = 0;
                  }
                  for (uVar54 = 0; uVar47 != uVar54; uVar54 = uVar54 + 1) {
                    value[uVar54] = local_8938->huff_dc[0].fast[uVar54 + uVar49 * uVar25 + -8];
                  }
                }
              }
              else {
                if (iVar16 == 0) {
                  bVar12 = stbi__get8(s);
                  iVar16 = (bVar12 & 0x7f) + 1;
                  uVar53 = (uint)(bVar12 >> 7);
                  goto LAB_001a1c84;
                }
                if (uVar53 == 0 || bVar58) {
                  uVar53 = (uint)(uVar53 != 0);
                  goto LAB_001a1c84;
                }
                uVar53 = 1;
              }
              for (uVar54 = 0; uVar47 != uVar54; uVar54 = uVar54 + 1) {
                psVar39->huff_dc[0].fast[uVar54 - 8] = value[uVar54];
              }
              iVar16 = iVar16 + -1;
              psVar39 = (stbi__jpeg *)(psVar39->huff_dc[0].fast + (uVar47 - 8));
              bVar58 = false;
            }
            if ((bVar15 >> 5 & 1) == 0) {
              iVar16 = uVar25 * uVar23;
              iVar21 = (uVar24 - 1) * iVar16;
              uVar26 = 0;
              for (uVar53 = 0; uVar53 != uVar24 + 1 >> 1; uVar53 = uVar53 + 1) {
                psVar39 = psVar29;
                for (iVar52 = iVar16; 0 < iVar52; iVar52 = iVar52 + -1) {
                  sVar9 = psVar39->huff_dc[0].fast[(ulong)uVar26 - 8];
                  psVar39->huff_dc[0].fast[(ulong)uVar26 - 8] =
                       psVar39->huff_dc[0].fast[(long)iVar21 + -8];
                  psVar39->huff_dc[0].fast[(long)iVar21 + -8] = sVar9;
                  psVar39 = (stbi__jpeg *)((long)&psVar39->s + 1);
                }
                uVar26 = uVar26 + iVar16;
                iVar21 = iVar21 - iVar16;
              }
            }
            free(local_8938);
          }
          if ((2 < uVar25) && (pal[0] == (stbi_uc  [4])0x0)) {
            iVar16 = uVar24 * uVar23;
            puVar43 = (undefined1 *)((long)&psVar29->s + 2);
            while (bVar58 = iVar16 != 0, iVar16 = iVar16 + -1, bVar58) {
              uVar3 = puVar43[-2];
              puVar43[-2] = *puVar43;
              *puVar43 = uVar3;
              puVar43 = puVar43 + uVar47;
            }
          }
          if (req_comp == 0) {
            return psVar29;
          }
          if (uVar25 == req_comp) {
            return psVar29;
          }
LAB_001a0bcd:
          puVar32 = stbi__convert_format((uchar *)psVar29,uVar25,req_comp,uVar23,uVar24);
          return puVar32;
        }
      }
      else {
LAB_001a00bf:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
      }
      lVar36 = *in_FS_OFFSET;
      pcVar35 = "unknown image type";
      goto LAB_0019e743;
    }
    y_00 = &s->img_y;
    comp_00 = &s->img_n;
    iVar16 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
    ri->bits_per_channel = iVar16;
    if (iVar16 == 0) {
      return (void *)0x0;
    }
    if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      sVar17 = *y_00;
      *y = sVar17;
      iVar16 = *comp_00;
      if (comp != (int *)0x0) {
        *comp = iVar16;
        sVar17 = *y_00;
      }
      sVar18 = s->img_x;
      iVar52 = ri->bits_per_channel / 8;
      iVar42 = stbi__mad4sizes_valid(iVar16,sVar18,sVar17,iVar52,iVar21);
      if (iVar42 != 0) {
        puVar32 = (uchar *)stbi__malloc_mad4(iVar16,sVar18,sVar17,iVar52,iVar21);
        if (puVar32 != (uchar *)0x0) {
          stbi__getn(s,puVar32,sVar17 * iVar16 * sVar18 * iVar52);
          if (req_comp == 0) {
            return puVar32;
          }
          if (*comp_00 != req_comp) {
            puVar32 = stbi__convert_format(puVar32,*comp_00,req_comp,s->img_x,s->img_y);
            return puVar32;
          }
          return puVar32;
        }
        goto LAB_001a01b0;
      }
    }
  }
LAB_001a0f5d:
  lVar36 = *in_FS_OFFSET;
  pcVar35 = "too large";
LAB_0019e743:
  *(char **)(lVar36 + -0x20) = pcVar35;
  return (void *)0x0;
LAB_001a0b64:
  lVar36 = *in_FS_OFFSET;
  pcVar35 = "bad file";
LAB_001a0b77:
  *(char **)(lVar36 + -0x20) = pcVar35;
LAB_001a0b8c:
  free(psVar29);
  psVar29 = (stbi__jpeg *)0x0;
LAB_001a0bae:
  *x = uVar23;
  *y = uVar24;
  bVar58 = req_comp != 0;
  if (bVar58) {
    uVar25 = req_comp;
  }
  req_comp = uVar25;
  if (!bVar58 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar25 = 4;
  goto LAB_001a0bcd;
LAB_001a0be6:
  pcVar35 = "bad huffman code";
  goto LAB_001a0faf;
LAB_0019f612:
  bVar12 = stbi__get_marker(psVar29);
  goto LAB_0019f5af;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}